

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  format_specs *pfVar4;
  num_writer f;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  int iVar10;
  int num_digits;
  string_view prefix;
  string groups;
  undefined4 uStack_6c;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  wchar_t local_28;
  
  grouping_impl<wchar_t>(&local_68,(locale_ref)(this->writer->locale_).locale_);
  if (local_68._M_string_length == 0) {
    on_dec(this);
    goto LAB_001ae5de;
  }
  wVar5 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  if (wVar5 == L'\0') {
    on_dec(this);
    goto LAB_001ae5de;
  }
  uVar3 = this->abs_value;
  uVar9 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar10 = (uVar9 + 1) -
           (uint)(uVar3 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar9 * 4));
  pcVar1 = local_68._M_dataplus._M_p + local_68._M_string_length;
  _Var8._M_p = local_68._M_dataplus._M_p;
  iVar6 = iVar10;
  if (local_68._M_string_length == 0) {
LAB_001ae546:
    iVar7 = iVar6;
    num_digits = iVar10;
    if (_Var8._M_p == pcVar1) goto LAB_001ae550;
  }
  else {
    num_digits = iVar10 + (int)local_68._M_string_length;
    do {
      cVar2 = *_Var8._M_p;
      iVar7 = iVar6 - cVar2;
      if ((iVar7 == 0 || iVar6 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_001ae546;
      iVar10 = iVar10 + 1;
      _Var8._M_p = _Var8._M_p + 1;
      local_68._M_string_length = local_68._M_string_length - 1;
      iVar6 = iVar7;
    } while (local_68._M_string_length != 0);
LAB_001ae550:
    num_digits = (iVar7 + -1) / (int)pcVar1[-1] + num_digits;
  }
  pfVar4 = this->specs;
  local_28 = (pfVar4->fill).data_[5];
  local_48._0_4_ = pfVar4->width;
  local_48._4_4_ = pfVar4->precision;
  uStack_40._0_1_ = pfVar4->type;
  uStack_40._1_3_ = *(undefined3 *)&pfVar4->field_0x9;
  uStack_40._4_4_ = (pfVar4->fill).data_[0];
  local_38 = *(undefined8 *)((pfVar4->fill).data_ + 1);
  uStack_30 = *(undefined8 *)((pfVar4->fill).data_ + 3);
  f._20_4_ = uStack_6c;
  f.sep = wVar5;
  f.size = num_digits;
  f.abs_value = uVar3;
  f.groups = &local_68;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,*pfVar4,
             f);
LAB_001ae5de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }